

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,Type args_2,QPointingDevice *args_3,
               QList<QEventPoint> *args_4,QFlags<Qt::KeyboardModifier> args_5)

{
  long lVar1;
  bool bVar2;
  QList<QEventPoint> *in_RCX;
  undefined4 in_EDX;
  QList<QEventPoint> *in_RDI;
  QWindow *in_R8;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QList<QEventPoint> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  Type args_2_00;
  unsigned_long in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  QFlagsStorage<Qt::KeyboardModifier> args_5_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined6 in_stack_ffffffffffffff80;
  byte bVar3;
  byte bVar4;
  QWindow *args_00;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffffbc;
  
  args_5_00.i = (Int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  args_2_00 = (Type)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = 0;
  bVar3 = 0;
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    args_00 = in_R8;
    QList<QEventPoint>::QList
              (in_stack_ffffffffffffff30,
               (QList<QEventPoint> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    bVar4 = 1;
    bVar2 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
                      (args_00,CONCAT17(1,CONCAT16(bVar3,in_stack_ffffffffffffff80)),
                       (Type)((ulong)in_R8 >> 0x20),
                       (QPointingDevice *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_RCX,
                       (QFlags<Qt::KeyboardModifier>)in_stack_ffffffffffffffbc.i);
  }
  else {
    QList<QEventPoint>::QList
              (in_RDI,(QList<QEventPoint> *)
                      CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    bVar3 = 1;
    bVar2 = QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
                      ((QWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,args_2_00,(QPointingDevice *)in_RCX,
                       (QList<QEventPoint> *)CONCAT44(in_EDX,in_stack_ffffffffffffff40),
                       (QFlags<Qt::KeyboardModifier>)args_5_00.i);
  }
  if ((bVar3 & 1) != 0) {
    QList<QEventPoint>::~QList((QList<QEventPoint> *)0x44d194);
  }
  if ((bVar4 & 1) != 0) {
    QList<QEventPoint>::~QList((QList<QEventPoint> *)0x44d1aa);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}